

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluRenderConfig.hpp
# Opt level: O0

void __thiscall glu::RenderConfig::RenderConfig(RenderConfig *this,ContextType type_)

{
  RenderConfig *this_local;
  ContextType type__local;
  
  (this->type).super_ApiType.m_bits = (deUint32)type_.super_ApiType.m_bits;
  this->width = -1;
  this->height = -1;
  this->surfaceType = SURFACETYPE_DONT_CARE;
  this->windowVisibility = VISIBILITY_VISIBLE;
  this->id = -1;
  this->redBits = -1;
  this->greenBits = -1;
  this->blueBits = -1;
  this->alphaBits = -1;
  this->depthBits = -1;
  this->stencilBits = -1;
  this->numSamples = -1;
  this->resetNotificationStrategy = RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED;
  return;
}

Assistant:

RenderConfig (ContextType type_ = ContextType())
		: type						(type_)
		, width						(DONT_CARE)
		, height					(DONT_CARE)
		, surfaceType				(SURFACETYPE_DONT_CARE)
		, windowVisibility			(VISIBILITY_VISIBLE)
		, id						(DONT_CARE)
		, redBits					(DONT_CARE)
		, greenBits					(DONT_CARE)
		, blueBits					(DONT_CARE)
		, alphaBits					(DONT_CARE)
		, depthBits					(DONT_CARE)
		, stencilBits				(DONT_CARE)
		, numSamples				(DONT_CARE)
		, resetNotificationStrategy	(RESET_NOTIFICATION_STRATEGY_NOT_SPECIFIED)
	{
	}